

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_elfread.c
# Opt level: O3

int elf_load_nolibelf_section
              (void *obj,Dwarf_Unsigned section_index,Dwarf_Small **return_data,int *error)

{
  Dwarf_Small *pDVar1;
  ulong uVar2;
  int iVar3;
  char *buf;
  long lVar4;
  size_t __size;
  ulong loc;
  Dwarf_Unsigned size;
  
  if (section_index == 0) {
    return -1;
  }
  if (*(ulong *)((long)obj + 0xa0) <= section_index) {
    return -1;
  }
  pDVar1 = *(Dwarf_Small **)(*(long *)((long)obj + 0xb8) + 0x68 + section_index * 0xa0);
  if (pDVar1 == (Dwarf_Small *)0x0) {
    lVar4 = *(long *)((long)obj + 0xb8) + section_index * 0xa0;
    __size = *(size_t *)(lVar4 + 0x38);
    if (__size == 0) {
      return -1;
    }
    uVar2 = *(ulong *)((long)obj + 0x28);
    if ((uVar2 < __size) || (loc = *(ulong *)(lVar4 + 0x30), uVar2 < loc || uVar2 < __size + loc)) {
      *error = 0x1be;
    }
    else {
      buf = (char *)malloc(__size);
      *(char **)(lVar4 + 0x68) = buf;
      if (buf != (char *)0x0) {
        do {
          size = 0x7ff00000;
          if (__size < 0x7ff00000) {
            size = __size;
          }
          iVar3 = _dwarf_object_read_random
                            (*(int *)((long)obj + 0x10),buf,loc,size,
                             *(Dwarf_Unsigned *)((long)obj + 0x28),error);
          if (iVar3 != 0) {
            free(*(void **)(lVar4 + 0x68));
            *(undefined8 *)(lVar4 + 0x68) = 0;
            return iVar3;
          }
          loc = loc + size;
          buf = buf + size;
          __size = __size - size;
        } while (__size != 0);
        *return_data = *(Dwarf_Small **)(lVar4 + 0x68);
        goto LAB_00187d1e;
      }
      *error = 0x3e;
    }
    iVar3 = 1;
  }
  else {
    *return_data = pDVar1;
LAB_00187d1e:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
elf_load_nolibelf_section (void *obj, Dwarf_Unsigned section_index,
    Dwarf_Small **return_data, int *error)
{
    /*  Linux kernel read size limit 0x7ffff000,
        Without any good reason, limit our reads
        to a bit less. */
    const Dwarf_Unsigned read_size_limit = 0x7ff00000;
    Dwarf_Unsigned read_offset = 0;
    Dwarf_Unsigned read_size = 0;
    Dwarf_Unsigned remaining_bytes = 0;
    Dwarf_Small *  read_target = 0;
    dwarf_elf_object_access_internals_t *elf =
        (dwarf_elf_object_access_internals_t*)(obj);

    if (0 < section_index &&
        section_index < elf->f_loc_shdr.g_count) {
        int res = 0;

        struct generic_shdr *sp =
            elf->f_shdr + section_index;
        if (sp->gh_content) {
            *return_data = (Dwarf_Small *)sp->gh_content;
            return DW_DLV_OK;
        }
        if (!sp->gh_size) {
            return DW_DLV_NO_ENTRY;
        }
        /*  Guarding against bad values and
            against overflow */
        if (sp->gh_size > elf->f_filesize ||
            sp->gh_offset > elf->f_filesize ||
            (sp->gh_size + sp->gh_offset) >
                elf->f_filesize) {
            *error = DW_DLE_ELF_SECTION_ERROR;
            return DW_DLV_ERROR;
        }

        sp->gh_content = malloc((size_t)sp->gh_size);
        if (!sp->gh_content) {
            *error = DW_DLE_ALLOC_FAIL;
            return DW_DLV_ERROR;
        }
        /*  Linux has a 2GB limit on read size.
            So break this into 2gb pieces.  */
        remaining_bytes = sp->gh_size;
        read_size = remaining_bytes;
        read_offset = sp->gh_offset;
        read_target = (Dwarf_Small*)sp->gh_content;
        for ( ; remaining_bytes > 0; read_size = remaining_bytes ) {
            if (read_size > read_size_limit) {
                read_size = read_size_limit;
            }
            res = RRMOA(elf->f_fd,
                (void *)read_target, read_offset,
                read_size,
                elf->f_filesize, error);
            if (res != DW_DLV_OK) {
                free(sp->gh_content);
                sp->gh_content = 0;
                return res;
            }
            remaining_bytes -= read_size;
            read_offset += read_size;
            read_target += read_size;
        }
        *return_data = (Dwarf_Small *)sp->gh_content;
        return DW_DLV_OK;
    }
    return DW_DLV_NO_ENTRY;
}